

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O2

void Io_MvFree(Io_MvMan_t *p)

{
  Vec_Str_t *__ptr;
  void *__ptr_00;
  int i;
  Vec_Ptr_t *p_00;
  
  if (p->pDesign != (Abc_Des_t *)0x0) {
    Abc_DesFree(p->pDesign,(Abc_Ntk_t *)0x0);
  }
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  if (p->vLines != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vLines);
  }
  p_00 = p->vModels;
  if (p_00 != (Vec_Ptr_t *)0x0) {
    for (i = 0; i < p_00->nSize; i = i + 1) {
      __ptr_00 = Vec_PtrEntry(p_00,i);
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x60));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 8));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x10));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x18));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x20));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x28));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x30));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x38));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x40));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x48));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x50));
      Vec_PtrFree(*(Vec_Ptr_t **)((long)__ptr_00 + 0x58));
      free(__ptr_00);
      p_00 = p->vModels;
    }
    Vec_PtrFree(p_00);
  }
  Vec_PtrFree(p->vTokens);
  Vec_PtrFree(p->vTokens2);
  __ptr = p->vFunc;
  free(__ptr->pArray);
  free(__ptr);
  free(p);
  return;
}

Assistant:

static void Io_MvFree( Io_MvMan_t * p )
{
    Io_MvMod_t * pMod;
    int i;
    if ( p->pDesign )
        Abc_DesFree( p->pDesign, NULL );
    if ( p->pBuffer )  
        ABC_FREE( p->pBuffer );
    if ( p->vLines )
        Vec_PtrFree( p->vLines  );
    if ( p->vModels )
    {
        Vec_PtrForEachEntry( Io_MvMod_t *, p->vModels, pMod, i )
            Io_MvModFree( pMod );
        Vec_PtrFree( p->vModels );
    }
    Vec_PtrFree( p->vTokens );
    Vec_PtrFree( p->vTokens2 );
    Vec_StrFree( p->vFunc );
    ABC_FREE( p );
}